

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

void cs::collect_garbage(context_t *context)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  
  if (*(long *)(current_process + 0x88) != *(long *)(current_process + 0x80)) {
    do {
      stack_type<cs_impl::any,_std::allocator>::pop_no_return
                ((stack_type<cs_impl::any,_std::allocator> *)(current_process + 0x80));
    } while (*(long *)(current_process + 0x88) != *(long *)(current_process + 0x80));
  }
  peVar1 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    domain_manager::clear_all_data
              (&(((peVar1->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
    ::clear((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
             *)&((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->compiler).
                 super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->modules)
    ;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
    ::clear((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
             *)&((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->compiler).
                 super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->csyms);
    peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar2->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var3 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar2->context).
                     super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> + 8))
    ->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    peVar4 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var3 = (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    peVar1 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (peVar1->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var3 = (peVar1->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (peVar1->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    peVar1 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (peVar1->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var3 = (peVar1->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (peVar1->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    p_Var3 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  collect_garbage();
  return;
}

Assistant:

void collect_garbage(context_t &context)
	{
		while (!current_process->stack.empty())
			current_process->stack.pop_no_return();
#ifdef CS_DEBUGGER
		while(!current_process->stack_backtrace.empty())
			current_process->stack_backtrace.pop_no_return();
#endif
		if (context) {
			context->instance->storage.clear_all_data();
			context->compiler->modules.clear();
			context->compiler->csyms.clear();
			context->compiler->swap_context(nullptr);
			context->instance->context = nullptr;
			context->compiler = nullptr;
			context->instance = nullptr;
			context = nullptr;
		}
		collect_garbage();
	}